

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * google::protobuf::anon_unknown_1::ToJsonName(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (input->_M_dataplus)._M_p;
  sVar2 = input->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    if (pcVar1[sVar3] != '_') {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToJsonName(const std::string& input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  return result;
}